

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O1

int32_t ucal_getTimeZoneDisplayName_63
                  (UCalendar *cal,UCalendarDisplayNameType type,char *locale,UChar *result,
                  int32_t resultLength,UErrorCode *status)

{
  int32_t iVar1;
  TimeZone *this;
  UnicodeString id;
  Char16Ptr local_168;
  UChar *local_160;
  UnicodeString local_150;
  Locale local_110;
  
  if (U_ZERO_ERROR < *status) {
    return -1;
  }
  this = icu_63::Calendar::getTimeZone((Calendar *)cal);
  local_150.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003c0258;
  local_150.fUnion.fStackFields.fLengthAndFlags = 2;
  if (result != (UChar *)0x0 || resultLength != 0) {
    icu_63::UnicodeString::setTo(&local_150,result,0,resultLength);
  }
  switch(type) {
  case UCAL_STANDARD:
    icu_63::Locale::Locale(&local_110,locale,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::TimeZone::getDisplayName(this,'\0',LONG,&local_110,&local_150);
    break;
  case UCAL_SHORT_STANDARD:
    icu_63::Locale::Locale(&local_110,locale,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::TimeZone::getDisplayName(this,'\0',SHORT,&local_110,&local_150);
    break;
  case UCAL_DST:
    icu_63::Locale::Locale(&local_110,locale,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::TimeZone::getDisplayName(this,'\x01',LONG,&local_110,&local_150);
    break;
  case UCAL_SHORT_DST:
    icu_63::Locale::Locale(&local_110,locale,(char *)0x0,(char *)0x0,(char *)0x0);
    icu_63::TimeZone::getDisplayName(this,'\x01',SHORT,&local_110,&local_150);
    break;
  default:
    goto switchD_001e33b9_default;
  }
  icu_63::Locale::~Locale(&local_110);
switchD_001e33b9_default:
  local_168.p_ = result;
  iVar1 = icu_63::UnicodeString::extract(&local_150,&local_168,resultLength,status);
  local_160 = local_168.p_;
  icu_63::UnicodeString::~UnicodeString(&local_150);
  return iVar1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucal_getTimeZoneDisplayName(const     UCalendar*                 cal,
                    UCalendarDisplayNameType     type,
                    const char             *locale,
                    UChar*                  result,
                    int32_t                 resultLength,
                    UErrorCode*             status)
{

    if(U_FAILURE(*status)) return -1;

    const TimeZone& tz = ((Calendar*)cal)->getTimeZone();
    UnicodeString id;
    if(!(result==NULL && resultLength==0)) {
        // NULL destination for pure preflighting: empty dummy string
        // otherwise, alias the destination buffer
        id.setTo(result, 0, resultLength);
    }

    switch(type) {
  case UCAL_STANDARD:
      tz.getDisplayName(FALSE, TimeZone::LONG, Locale(locale), id);
      break;

  case UCAL_SHORT_STANDARD:
      tz.getDisplayName(FALSE, TimeZone::SHORT, Locale(locale), id);
      break;

  case UCAL_DST:
      tz.getDisplayName(TRUE, TimeZone::LONG, Locale(locale), id);
      break;

  case UCAL_SHORT_DST:
      tz.getDisplayName(TRUE, TimeZone::SHORT, Locale(locale), id);
      break;
    }

    return id.extract(result, resultLength, *status);
}